

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetCheckForward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int i;
  int iVar1;
  int iVar2;
  int *piVar3;
  int i_00;
  Wln_Ntk_t *p_00;
  long lVar4;
  int iVar5;
  
  i_00 = 0;
  do {
    if (vSet->nSize <= i_00) {
      return 1;
    }
    i = Vec_IntEntry(vSet,i_00);
    iVar5 = -1;
    for (lVar4 = 0; lVar4 < p->pNtk->vFanins[i].nSize; lVar4 = lVar4 + 1) {
      piVar3 = Wln_RetFanins(p,i);
      iVar1 = piVar3[lVar4 * 2];
      piVar3 = Wln_RetFanins(p,i);
      iVar2 = iVar5;
      if ((long)iVar1 != 0) {
        p_00 = p->pNtk;
        if (p_00->vFanins[iVar1].nSize == 0) {
          iVar1 = Wln_ObjIsCi(p_00,iVar1);
          if (iVar1 == 0) goto LAB_0031f79f;
          p_00 = p->pNtk;
        }
        iVar1 = Wln_ObjIsFf(p_00,i);
        if ((lVar4 == 0) || (iVar1 == 0)) {
          if (piVar3[lVar4 * 2 + 1] == 0) {
            return 0;
          }
          iVar1 = Vec_IntEntry(&p->vEdgeLinks,piVar3[lVar4 * 2 + 1] + 1);
          iVar2 = Wln_ObjIsFf(p->pNtk,iVar1);
          if (iVar2 == 0) {
            __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnRetime.c"
                          ,0x16f,"int Wln_RetCheckForwardOne(Wln_Ret_t *, int)");
          }
          iVar1 = Vec_IntEntry(&p->vFfClasses,iVar1);
          iVar2 = iVar1;
          if ((iVar5 != -1) && (iVar2 = iVar5, iVar5 != iVar1)) {
            return 0;
          }
        }
      }
LAB_0031f79f:
      iVar5 = iVar2;
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

int Wln_RetCheckForward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj;
    Vec_IntForEachEntry( vSet, iObj, i )
        if ( !Wln_RetCheckForwardOne( p, iObj ) )
            return 0;
    return 1;
}